

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

size_t __thiscall Corrade::Utility::Arguments::arrayValueCount(Arguments *this,string *key)

{
  ulong uVar1;
  bool bVar2;
  Entry *pEVar3;
  ostream *poVar4;
  Debug *pDVar5;
  size_t sVar6;
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  *this_00;
  Flags local_109;
  Error local_108;
  EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)__xff_> local_db;
  EnumSet local_da;
  Flags local_d9;
  Error local_d8;
  Flags local_a9;
  Error local_a8;
  Flags local_79;
  Error local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Entry *local_20;
  Entry *found;
  string *key_local;
  Arguments *this_local;
  
  found = (Entry *)key;
  key_local = (string *)this;
  std::operator+(&local_40,&this->_prefix,key);
  pEVar3 = find(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_20 = pEVar3;
  if (pEVar3 == (Entry *)0x0) {
    poVar4 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_79);
    Error::Error(&local_78,poVar4,local_79);
    pDVar5 = Debug::operator<<(&local_78.super_Debug,"Utility::Arguments::arrayValueCount(): key");
    pDVar5 = operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               found);
    Debug::operator<<(pDVar5,"not found");
    Error::~Error(&local_78);
    abort();
  }
  if ((pEVar3->type != ArrayArgument) && (pEVar3->type != ArrayOption)) {
    poVar4 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_a9);
    Error::Error(&local_a8,poVar4,local_a9);
    pDVar5 = Debug::operator<<(&local_a8.super_Debug,
                               "Utility::Arguments::arrayValueCount(): cannot use this function for a non-array option"
                              );
    operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)found);
    Error::~Error(&local_a8);
    abort();
  }
  uVar1 = pEVar3->id;
  sVar6 = Containers::
          Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
          ::size(&this->_arrayValues);
  if (sVar6 <= uVar1) {
    poVar4 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_d9);
    Error::Error(&local_d8,poVar4,local_d9);
    Debug::operator<<(&local_d8.super_Debug,
                      "Assertion found->id < _arrayValues.size() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:1132"
                     );
    Error::~Error(&local_d8);
    abort();
  }
  Containers::EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
            (&local_db,Parsed);
  local_da = (EnumSet)Containers::
                      EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)'\xff'>::
                      operator&(&this->_flags,local_db);
  bVar2 = Containers::EnumSet::operator_cast_to_bool(&local_da);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    this_00 = Containers::
              Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
              ::operator[]<unsigned_long,_0>(&this->_arrayValues,local_20->id);
    sVar6 = Containers::
            Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
            ::size(this_00);
    return sVar6;
  }
  poVar4 = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_109);
  Error::Error(&local_108,poVar4,local_109);
  Debug::operator<<(&local_108.super_Debug,
                    "Utility::Arguments::arrayValueCount(): arguments were not successfully parsed yet"
                   );
  Error::~Error(&local_108);
  abort();
}

Assistant:

std::size_t Arguments::arrayValueCount(const std::string& key) const {
    const Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::arrayValueCount(): key" << key << "not found", {});
    CORRADE_ASSERT(found->type == Type::ArrayArgument || found->type == Type::ArrayOption,
        "Utility::Arguments::arrayValueCount(): cannot use this function for a non-array option" << key, {});
    CORRADE_INTERNAL_ASSERT(found->id < _arrayValues.size());
    CORRADE_ASSERT(_flags & InternalFlag::Parsed, "Utility::Arguments::arrayValueCount(): arguments were not successfully parsed yet", {});
    return _arrayValues[found->id].size();
}